

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpdf-test-compare.cc
# Opt level: O2

void cleanTrailer(QPDFObjectHandle *trailer)

{
  char cVar1;
  __type _Var2;
  int iVar3;
  char acStack_68 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_60;
  QPDFObjectHandle id;
  string id0;
  string id1;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&id0,"/Length",(allocator<char> *)&id1);
  QPDFObjectHandle::removeKey((string *)trailer);
  std::__cxx11::string::~string((string *)&id0);
  std::__cxx11::string::string<std::allocator<char>>((string *)&id0,"/ID",(allocator<char> *)&id1);
  QPDFObjectHandle::getKey((string *)&id);
  std::__cxx11::string::~string((string *)&id0);
  cVar1 = QPDFObjectHandle::isArray();
  if (cVar1 != '\0') {
    iVar3 = QPDFObjectHandle::getArrayNItems();
    if (iVar3 == 2) {
      QPDFObjectHandle::getArrayItem((int)&id1);
      QPDFObjectHandle::unparse_abi_cxx11_();
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&id1._M_string_length);
      QPDFObjectHandle::getArrayItem((int)acStack_68);
      QPDFObjectHandle::unparse_abi_cxx11_();
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_60);
      operator____qpdf(acStack_68,0x105271);
      QPDFObjectHandle::setArrayItem((int)&id,(QPDFObjectHandle *)0x1);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_60);
      _Var2 = std::operator==(&id0,&id1);
      if (_Var2) {
        operator____qpdf(acStack_68,0x105271);
        QPDFObjectHandle::setArrayItem((int)&id,(QPDFObjectHandle *)0x0);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_60);
      }
      std::__cxx11::string::~string((string *)&id1);
      std::__cxx11::string::~string((string *)&id0);
    }
  }
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&id.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  return;
}

Assistant:

void
cleanTrailer(QPDFObjectHandle& trailer)
{
    // If the trailer is an object stream, it will have /Length.
    trailer.removeKey("/Length");
    // Disregard the second half of /ID. This doesn't have anything directly to do with zlib, but
    // lots of tests use --deterministic-id, and that is affected. The deterministic ID tests
    // meaningfully exercise that deterministic IDs behave as expected, so for the rest of the
    // tests, it's okay to ignore /ID[1]. If the two halves of /ID are the same, ignore both since
    // this means qpdf completely generated the /ID rather than preserving the first half.
    auto id = trailer.getKey("/ID");
    if (id.isArray() && id.getArrayNItems() == 2) {
        auto id0 = id.getArrayItem(0).unparse();
        auto id1 = id.getArrayItem(1).unparse();
        id.setArrayItem(1, "()"_qpdf);
        if (id0 == id1) {
            id.setArrayItem(0, "()"_qpdf);
        }
    }
}